

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_setglobals_unittest.cc
# Opt level: O2

void Test_SetGlobalValue_TemplateDictionary::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  char *__s1;
  TemplateDictionaryPeer peer;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateString local_a8;
  TemplateDictionary tpl;
  
  ctemplate::TemplateString::TemplateString(&local_a8,"TEST_GLOBAL_VAR");
  ctemplate::TemplateString::TemplateString(&local_c8,"test_value");
  TVar1.length_ = local_a8.length_;
  TVar1.ptr_ = local_a8.ptr_;
  TVar1.is_immutable_ = local_a8.is_immutable_;
  TVar1._17_7_ = local_a8._17_7_;
  TVar1.id_ = local_a8.id_;
  TVar2.length_ = local_c8.length_;
  TVar2.ptr_ = local_c8.ptr_;
  TVar2.is_immutable_ = local_c8.is_immutable_;
  TVar2._17_7_ = local_c8._17_7_;
  TVar2.id_ = local_c8.id_;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar1,TVar2);
  ctemplate::TemplateString::TemplateString(&local_e8,"empty");
  ctemplate::TemplateDictionary::TemplateDictionary(&tpl,&local_e8,(UnsafeArena *)0x0);
  peer.dict_ = &tpl;
  ctemplate::TemplateString::TemplateString(&local_e8,"TEST_GLOBAL_VAR");
  __s1 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_e8);
  iVar3 = strcmp(__s1,"test_value");
  if (iVar3 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(&tpl);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"TEST_GLOBAL_VAR\"), \"test_value\") == 0");
  exit(1);
}

Assistant:

TEST(SetGlobalValue, TemplateDictionary) {
  // Test to see that the global dictionary object gets created when you
  // first call the static function TemplateDictionary::SetGlobalValue().
  TemplateDictionary::SetGlobalValue("TEST_GLOBAL_VAR", "test_value");
  TemplateDictionary tpl("empty");
  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&tpl);
  EXPECT_STREQ(peer.GetSectionValue("TEST_GLOBAL_VAR"),
               "test_value");

}